

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModifiedPage.cpp
# Opt level: O3

uchar __thiscall PDFModifiedPage::GetDifferentChar(PDFModifiedPage *this,uchar inCharCode)

{
  uchar uVar1;
  
  if (8 < (byte)(inCharCode - 0x30)) {
    if (inCharCode == '9') {
      return '0';
    }
    if (0x18 < (byte)(inCharCode + 0x9f)) {
      if (inCharCode == 'z') {
        return 'a';
      }
      uVar1 = 'A';
      if ((byte)(inCharCode + 0xbf) < 0x19) {
        uVar1 = inCharCode + '\x01';
      }
      return uVar1;
    }
  }
  return inCharCode + '\x01';
}

Assistant:

unsigned char PDFModifiedPage::GetDifferentChar(unsigned char inCharCode)
{
    // numerals
    if(inCharCode >= 0x30 && inCharCode <= 0x38)
        return inCharCode+1;
    if(inCharCode == 0x39)
        return 0x30;

    // lowercase
    if(inCharCode >= 0x61 && inCharCode <= 0x79)
        return inCharCode+1;
    if(inCharCode == 0x7a)
        return 0x61;

    // uppercase
    if(inCharCode >= 0x41 && inCharCode <= 0x59)
        return inCharCode+1;
    if(inCharCode == 0x5a)
        return 0x41;

    return 0x41;
}